

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O3

void duckdb::STDDevBaseOperation::
     ConstantOperation<double,duckdb::StddevState,duckdb::STDDevPopOperation>
               (StddevState *state,double *input,AggregateUnaryInput *unary_input,idx_t count)

{
  uint64_t uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  if (count != 0) {
    uVar1 = state->count;
    dVar2 = state->mean;
    dVar3 = state->dsquared;
    do {
      uVar1 = uVar1 + 1;
      dVar4 = *input - dVar2;
      auVar5._8_4_ = (int)(uVar1 >> 0x20);
      auVar5._0_8_ = uVar1;
      auVar5._12_4_ = 0x45300000;
      dVar2 = dVar2 + dVar4 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      dVar3 = dVar3 + (*input - dVar2) * dVar4;
      state->mean = dVar2;
      state->dsquared = dVar3;
      count = count - 1;
    } while (count != 0);
    state->count = uVar1;
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}